

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_list_tstamp_types(pcap_t *p,int **tstamp_typesp)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  size_t __size;
  
  iVar3 = p->tstamp_type_count;
  __size = (size_t)iVar3;
  if (__size == 0) {
    *tstamp_typesp = (int *)0x0;
  }
  else {
    piVar1 = (int *)calloc(4,__size);
    *tstamp_typesp = piVar1;
    if (piVar1 == (int *)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      snprintf(p->errbuf,0x101,"malloc: %s",pcVar2);
      iVar3 = -1;
    }
    else {
      memcpy(piVar1,p->tstamp_type_list,__size << 2);
    }
  }
  return iVar3;
}

Assistant:

int
pcap_list_tstamp_types(pcap_t *p, int **tstamp_typesp)
{
	if (p->tstamp_type_count == 0) {
		/*
		 * We don't support multiple time stamp types.
		 */
		*tstamp_typesp = NULL;
	} else {
		*tstamp_typesp = (int*)calloc(sizeof(**tstamp_typesp),
		    p->tstamp_type_count);
		if (*tstamp_typesp == NULL) {
			(void)pcap_snprintf(p->errbuf, sizeof(p->errbuf),
			    "malloc: %s", pcap_strerror(errno));
			return (PCAP_ERROR);
		}
		(void)memcpy(*tstamp_typesp, p->tstamp_type_list,
		    sizeof(**tstamp_typesp) * p->tstamp_type_count);
	}
	return (p->tstamp_type_count);
}